

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::io::anon_unknown_0::TokenizerTest_SimpleTokens_DD_SimpleTokens_Test::TestBody
          (TokenizerTest_SimpleTokens_DD_SimpleTokens_Test *this)

{
  int block_size;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  bool bVar2;
  internal *piVar3;
  long lVar4;
  char *pcVar5;
  char *in_R9;
  string_view src;
  ScopedTrace gtest_trace_225;
  TestInputStream input;
  TestErrorCollector error_collector;
  Tokenizer tokenizer;
  long *local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  undefined1 local_1a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  ScopedTrace local_179;
  AssertHelper local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  AssertHelper local_168;
  long local_160;
  int *local_158;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_150;
  ArrayInputStream local_148;
  undefined4 local_128;
  TokenType *local_120;
  TestErrorCollector local_118;
  char *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  int local_c8;
  int local_c4;
  int local_c0 [36];
  
  local_160 = 0;
  do {
    piVar3 = (internal *)&io::(anonymous_namespace)::kSimpleTokenCases;
    local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (&io::(anonymous_namespace)::kSimpleTokenCases + local_160 * 5);
    local_120 = (TokenType *)(&DAT_019a4b50 + local_160 * 0x28);
    local_158 = &io::(anonymous_namespace)::kBlockSizes;
    lVar4 = 0;
    do {
      testing::Message::Message((Message *)&local_150);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_150._M_head_impl + 0x10),"kSimpleTokenCases case #",0x18);
      std::ostream::operator<<(local_150._M_head_impl + 0x10,(int)local_160);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_150._M_head_impl + 0x10),": ",2);
      _Var1._M_head_impl = local_150._M_head_impl;
      src._M_str = (char *)piVar3;
      src._M_len = (size_t)(local_170->_M_dataplus)._M_p;
      absl::lts_20250127::CEscape_abi_cxx11_
                ((string *)&local_f0,(lts_20250127 *)local_170->_M_string_length,src);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(_Var1._M_head_impl + 0x10),local_f0,(long)local_e8._M_dataplus._M_p);
      if ((size_type *)local_f0 != &local_e8._M_string_length) {
        operator_delete(local_f0,local_e8._M_string_length + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_150._M_head_impl + 0x10),", ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_150._M_head_impl + 0x10),"kBlockSizes case #",0x12);
      std::ostream::operator<<(local_150._M_head_impl + 0x10,(int)lVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_150._M_head_impl + 0x10),": ",2);
      block_size = *local_158;
      std::ostream::operator<<(local_150._M_head_impl + 0x10,block_size);
      testing::ScopedTrace::ScopedTrace<testing::Message>
                (&local_179,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0xe1,(Message *)&local_150);
      if (local_150._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(undefined **)local_150._M_head_impl + 8))();
      }
      local_150._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR__TestInputStream_018eade8;
      ArrayInputStream::ArrayInputStream
                (&local_148,(local_170->_M_dataplus)._M_p,(int)local_170->_M_string_length,
                 block_size);
      local_128 = 0;
      local_118.super_ErrorCollector._vptr_ErrorCollector =
           (_func_int **)&PTR__TestErrorCollector_018eae48;
      local_118.text_._M_dataplus._M_p = (pointer)&local_118.text_.field_2;
      local_118.text_._M_string_length = 0;
      local_118.text_.field_2._M_local_buf[0] = '\0';
      Tokenizer::Tokenizer
                ((Tokenizer *)&local_f0,(ZeroCopyInputStream *)&local_150,
                 &local_118.super_ErrorCollector);
      local_1b0 = (long *)((ulong)local_1b0 & 0xffffffff00000000);
      testing::internal::
      CmpHelperEQ<google::protobuf::io::Tokenizer::TokenType,google::protobuf::io::Tokenizer::TokenType>
                ((internal *)local_1a0,"Tokenizer::TYPE_START","tokenizer.current().type",
                 (TokenType *)&local_1b0,(TokenType *)&local_f0);
      if (local_1a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_1b0);
        pcVar5 = anon_var_dwarf_a22956 + 5;
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_198->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_178,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0xe9,pcVar5);
        testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_1b0);
        testing::internal::AssertHelper::~AssertHelper(&local_178);
        if (local_1b0 != (long *)0x0) {
          (**(code **)(*local_1b0 + 8))();
        }
      }
      if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_198,local_198);
      }
      testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
                ((internal *)local_1a0,"\"\"","tokenizer.current().text",
                 (char (*) [1])(anon_var_dwarf_a22956 + 5),&local_e8);
      if (local_1a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_1b0);
        pcVar5 = anon_var_dwarf_a22956 + 5;
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_198->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_178,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0xea,pcVar5);
        testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_1b0);
        testing::internal::AssertHelper::~AssertHelper(&local_178);
        if (local_1b0 != (long *)0x0) {
          (**(code **)(*local_1b0 + 8))();
        }
      }
      if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_198,local_198);
      }
      local_1b0 = (long *)((ulong)local_1b0 & 0xffffffff00000000);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_1a0,"0","tokenizer.current().line",(int *)&local_1b0,&local_c8);
      if (local_1a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_1b0);
        pcVar5 = anon_var_dwarf_a22956 + 5;
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_198->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_178,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0xeb,pcVar5);
        testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_1b0);
        testing::internal::AssertHelper::~AssertHelper(&local_178);
        if (local_1b0 != (long *)0x0) {
          (**(code **)(*local_1b0 + 8))();
        }
      }
      if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_198,local_198);
      }
      local_1b0 = (long *)((ulong)local_1b0 & 0xffffffff00000000);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_1a0,"0","tokenizer.current().column",(int *)&local_1b0,&local_c4)
      ;
      if (local_1a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_1b0);
        pcVar5 = anon_var_dwarf_a22956 + 5;
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_198->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_178,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0xec,pcVar5);
        testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_1b0);
        testing::internal::AssertHelper::~AssertHelper(&local_178);
        if (local_1b0 != (long *)0x0) {
          (**(code **)(*local_1b0 + 8))();
        }
      }
      if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_198,local_198);
      }
      local_1b0 = (long *)((ulong)local_1b0 & 0xffffffff00000000);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_1a0,"0","tokenizer.current().end_column",(int *)&local_1b0,
                 local_c0);
      if (local_1a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_1b0);
        pcVar5 = anon_var_dwarf_a22956 + 5;
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_198->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_178,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0xed,pcVar5);
        testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_1b0);
        testing::internal::AssertHelper::~AssertHelper(&local_178);
        if (local_1b0 != (long *)0x0) {
          (**(code **)(*local_1b0 + 8))();
        }
      }
      if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_198,local_198);
      }
      bVar2 = Tokenizer::Next((Tokenizer *)&local_f0);
      local_1b0 = (long *)CONCAT71(local_1b0._1_7_,bVar2);
      local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar2) {
        testing::internal::
        CmpHelperEQ<google::protobuf::io::Tokenizer::TokenType,google::protobuf::io::Tokenizer::TokenType>
                  ((internal *)local_1a0,"kSimpleTokenCases_case.type","tokenizer.current().type",
                   local_120,(TokenType *)&local_f0);
        if (local_1a0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1b0);
          pcVar5 = anon_var_dwarf_a22956 + 5;
          if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_178,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0xf3,pcVar5);
          testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_178);
          if (local_1b0 != (long *)0x0) {
            (**(code **)(*local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                  ((internal *)local_1a0,"kSimpleTokenCases_case.input","tokenizer.current().text",
                   local_170,&local_e8);
        if (local_1a0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1b0);
          pcVar5 = anon_var_dwarf_a22956 + 5;
          if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_178,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0xf5,pcVar5);
          testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_178);
          if (local_1b0 != (long *)0x0) {
            (**(code **)(*local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        local_1b0 = (long *)((ulong)local_1b0 & 0xffffffff00000000);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1a0,"0","tokenizer.current().line",(int *)&local_1b0,&local_c8)
        ;
        if (local_1a0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1b0);
          pcVar5 = anon_var_dwarf_a22956 + 5;
          if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_178,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0xf7,pcVar5);
          testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_178);
          if (local_1b0 != (long *)0x0) {
            (**(code **)(*local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        local_1b0 = (long *)((ulong)local_1b0 & 0xffffffff00000000);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1a0,"0","tokenizer.current().column",(int *)&local_1b0,
                   &local_c4);
        if (local_1a0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1b0);
          pcVar5 = anon_var_dwarf_a22956 + 5;
          if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_178,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0xf8,pcVar5);
          testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_178);
          if (local_1b0 != (long *)0x0) {
            (**(code **)(*local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        local_1b0 = (long *)local_170->_M_string_length;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)local_1a0,"kSimpleTokenCases_case.input.size()",
                   "tokenizer.current().end_column",(unsigned_long *)&local_1b0,local_c0);
        if (local_1a0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1b0);
          pcVar5 = anon_var_dwarf_a22956 + 5;
          if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_178,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0xfa,pcVar5);
          testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_178);
          if (local_1b0 != (long *)0x0) {
            (**(code **)(*local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        bVar2 = Tokenizer::Next((Tokenizer *)&local_f0);
        local_1b0 = (long *)CONCAT71(local_1b0._1_7_,!bVar2);
        local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar2) {
          testing::Message::Message((Message *)&local_178);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_1a0,(internal *)&local_1b0,
                     (AssertionResult *)"tokenizer.Next()","true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_168,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0xfd,(char *)CONCAT71(local_1a0._1_7_,local_1a0[0]));
          testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_178);
          testing::internal::AssertHelper::~AssertHelper(&local_168);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1a0._1_7_,local_1a0[0]) != &local_190) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_1a0._1_7_,local_1a0[0]),
                            local_190._M_allocated_capacity + 1);
          }
          if (local_178.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_178.data_ + 8))();
          }
          if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_1a8,local_1a8);
          }
        }
        local_1b0 = (long *)CONCAT44(local_1b0._4_4_,1);
        testing::internal::
        CmpHelperEQ<google::protobuf::io::Tokenizer::TokenType,google::protobuf::io::Tokenizer::TokenType>
                  ((internal *)local_1a0,"Tokenizer::TYPE_END","tokenizer.current().type",
                   (TokenType *)&local_1b0,(TokenType *)&local_f0);
        if (local_1a0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1b0);
          pcVar5 = anon_var_dwarf_a22956 + 5;
          if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_178,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x100,pcVar5);
          testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_178);
          if (local_1b0 != (long *)0x0) {
            (**(code **)(*local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
                  ((internal *)local_1a0,"\"\"","tokenizer.current().text",
                   (char (*) [1])(anon_var_dwarf_a22956 + 5),&local_e8);
        if (local_1a0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1b0);
          pcVar5 = anon_var_dwarf_a22956 + 5;
          if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_178,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x101,pcVar5);
          testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_178);
          if (local_1b0 != (long *)0x0) {
            (**(code **)(*local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        local_1b0 = (long *)((ulong)local_1b0 & 0xffffffff00000000);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1a0,"0","tokenizer.current().line",(int *)&local_1b0,&local_c8)
        ;
        if (local_1a0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1b0);
          pcVar5 = anon_var_dwarf_a22956 + 5;
          if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_178,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x102,pcVar5);
          testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_178);
          if (local_1b0 != (long *)0x0) {
            (**(code **)(*local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        local_1b0 = (long *)local_170->_M_string_length;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)local_1a0,"kSimpleTokenCases_case.input.size()",
                   "tokenizer.current().column",(unsigned_long *)&local_1b0,&local_c4);
        if (local_1a0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1b0);
          pcVar5 = anon_var_dwarf_a22956 + 5;
          if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_178,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x103,pcVar5);
          testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_178);
          if (local_1b0 != (long *)0x0) {
            (**(code **)(*local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        local_1b0 = (long *)local_170->_M_string_length;
        piVar3 = (internal *)&local_1b0;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)local_1a0,"kSimpleTokenCases_case.input.size()",
                   "tokenizer.current().end_column",(unsigned_long *)&local_1b0,local_c0);
        if (local_1a0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1b0);
          pcVar5 = anon_var_dwarf_a22956 + 5;
          if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_198->_M_dataplus)._M_p;
          }
          piVar3 = (internal *)0x105;
          testing::internal::AssertHelper::AssertHelper
                    (&local_178,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x105,pcVar5);
          testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_178);
          if (local_1b0 != (long *)0x0) {
            (**(code **)(*local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        local_1b0 = (long *)CONCAT71(local_1b0._1_7_,local_118.text_._M_string_length == 0);
        local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_118.text_._M_string_length != 0) {
          testing::Message::Message((Message *)&local_178);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_1a0,(internal *)&local_1b0,
                     (AssertionResult *)"error_collector.text_.empty()","false","true",in_R9);
          piVar3 = (internal *)0x108;
          testing::internal::AssertHelper::AssertHelper
                    (&local_168,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x108,(char *)CONCAT71(local_1a0._1_7_,local_1a0[0]));
          testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_178);
          goto LAB_00b2719e;
        }
      }
      else {
        testing::Message::Message((Message *)&local_178);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1a0,(internal *)&local_1b0,(AssertionResult *)"tokenizer.Next()",
                   "false","true",in_R9);
        piVar3 = (internal *)&DAT_000000f0;
        testing::internal::AssertHelper::AssertHelper
                  (&local_168,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0xf0,(char *)CONCAT71(local_1a0._1_7_,local_1a0[0]));
        testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_178);
LAB_00b2719e:
        testing::internal::AssertHelper::~AssertHelper(&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1a0._1_7_,local_1a0[0]) != &local_190) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_1a0._1_7_,local_1a0[0]),
                          local_190._M_allocated_capacity + 1);
        }
        if (local_178.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_178.data_ + 8))();
        }
        if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1a8,local_1a8);
        }
      }
      Tokenizer::~Tokenizer((Tokenizer *)&local_f0);
      TestErrorCollector::~TestErrorCollector(&local_118);
      testing::ScopedTrace::~ScopedTrace(&local_179);
      lVar4 = lVar4 + 1;
      local_158 = local_158 + 1;
    } while (lVar4 != 8);
    local_160 = local_160 + 1;
    if (local_160 == 0x1e) {
      return;
    }
  } while( true );
}

Assistant:

TEST_2D(TokenizerTest, SimpleTokens, kSimpleTokenCases, kBlockSizes) {
  // Set up the tokenizer.
  TestInputStream input(kSimpleTokenCases_case.input.data(),
                        kSimpleTokenCases_case.input.size(), kBlockSizes_case);
  TestErrorCollector error_collector;
  Tokenizer tokenizer(&input, &error_collector);

  // Before Next() is called, the initial token should always be TYPE_START.
  EXPECT_EQ(Tokenizer::TYPE_START, tokenizer.current().type);
  EXPECT_EQ("", tokenizer.current().text);
  EXPECT_EQ(0, tokenizer.current().line);
  EXPECT_EQ(0, tokenizer.current().column);
  EXPECT_EQ(0, tokenizer.current().end_column);

  // Parse the token.
  ASSERT_TRUE(tokenizer.Next());

  // Check that it has the right type.
  EXPECT_EQ(kSimpleTokenCases_case.type, tokenizer.current().type);
  // Check that it contains the complete input text.
  EXPECT_EQ(kSimpleTokenCases_case.input, tokenizer.current().text);
  // Check that it is located at the beginning of the input
  EXPECT_EQ(0, tokenizer.current().line);
  EXPECT_EQ(0, tokenizer.current().column);
  EXPECT_EQ(kSimpleTokenCases_case.input.size(),
            tokenizer.current().end_column);

  // There should be no more input.
  EXPECT_FALSE(tokenizer.Next());

  // After Next() returns false, the token should have type TYPE_END.
  EXPECT_EQ(Tokenizer::TYPE_END, tokenizer.current().type);
  EXPECT_EQ("", tokenizer.current().text);
  EXPECT_EQ(0, tokenizer.current().line);
  EXPECT_EQ(kSimpleTokenCases_case.input.size(), tokenizer.current().column);
  EXPECT_EQ(kSimpleTokenCases_case.input.size(),
            tokenizer.current().end_column);

  // There should be no errors.
  EXPECT_TRUE(error_collector.text_.empty());
}